

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int write_path_table(archive_write *a,int type_m,vdd *vdd)

{
  ulong uVar1;
  void *pvVar2;
  isoent **ppiVar3;
  isoent *piVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong __n;
  long lVar14;
  int iVar15;
  ulong uVar16;
  
  iVar5 = vdd->max_depth;
  if (iVar5 < 1) {
    iVar15 = 0;
  }
  else {
    lVar9 = 0;
    uVar11 = 0;
    do {
      iVar15 = vdd->pathtbl[lVar9].cnt;
      uVar16 = 0;
      if (iVar15 != 0) {
        pvVar2 = a->format_data;
        lVar12 = *(long *)((long)pvVar2 + 0x102e0);
        uVar10 = (long)pvVar2 + (0x102dc - lVar12);
        lVar13 = (long)pvVar2 + (0x102db - lVar12);
        if (iVar15 < 1) {
          uVar16 = 0;
        }
        else {
          ppiVar3 = vdd->pathtbl[lVar9].sorted;
          lVar14 = 0;
          uVar16 = 0;
          do {
            piVar4 = ppiVar3[lVar14];
            if (piVar4->identifier == (char *)0x0) {
              __n = 1;
            }
            else {
              __n = (ulong)piVar4->id_len;
            }
            sVar8 = (lVar13 - uVar10) + 1;
            uVar1 = __n + 9;
            if (lVar12 - sVar8 < uVar1) {
              iVar5 = wb_consume(a,sVar8);
              if (iVar5 < 0) {
                return iVar5;
              }
              pvVar2 = a->format_data;
              lVar12 = *(long *)((long)pvVar2 + 0x102e0);
              uVar10 = (long)pvVar2 + (0x102dc - lVar12);
              lVar13 = (long)pvVar2 + (0x102db - lVar12);
            }
            *(char *)(lVar13 + 1) = (char)__n;
            *(undefined1 *)(lVar13 + 2) = 0;
            uVar6 = piVar4->dir_location;
            if (type_m == 0) {
              *(uint *)(lVar13 + 3) = uVar6;
              uVar7 = piVar4->parent->dir_number;
              uVar6 = uVar7 >> 8;
            }
            else {
              *(uint *)(lVar13 + 3) =
                   uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
              uVar6 = piVar4->parent->dir_number;
              uVar7 = uVar6 >> 8;
            }
            *(char *)(lVar13 + 7) = (char)uVar7;
            *(char *)(lVar13 + 8) = (char)uVar6;
            if (piVar4->identifier == (char *)0x0) {
              *(undefined1 *)(lVar13 + 9) = 0;
            }
            else {
              memcpy((undefined1 *)(lVar13 + 9),piVar4->identifier,__n);
            }
            if ((__n & 1) != 0) {
              __n = __n + 1;
              *(undefined1 *)(lVar13 + uVar1) = 0;
            }
            uVar16 = (ulong)((int)uVar16 + (int)__n + 8);
            lVar13 = lVar13 + __n + 8;
            lVar14 = lVar14 + 1;
          } while (lVar14 < vdd->pathtbl[lVar9].cnt);
        }
        sVar8 = (lVar13 + 1U) - uVar10;
        if ((uVar10 <= lVar13 + 1U && sVar8 != 0) && (iVar5 = wb_consume(a,sVar8), iVar5 < 0)) {
          return iVar5;
        }
        if ((int)uVar16 < 0) {
          return (int)uVar16;
        }
        iVar5 = vdd->max_depth;
      }
      iVar15 = (int)uVar16;
      uVar11 = uVar11 + uVar16;
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar5);
    if ((uVar11 & 0xfff) != 0) {
      iVar5 = write_null(a,0x1000 - (uVar11 & 0xfff));
      return iVar5;
    }
  }
  return iVar15;
}

Assistant:

static int
write_path_table(struct archive_write *a, int type_m, struct vdd *vdd)
{
	int depth, r;
	size_t path_table_size;

	r = ARCHIVE_OK;
	path_table_size = 0;
	for (depth = 0; depth < vdd->max_depth; depth++) {
		r = _write_path_table(a, type_m, depth, vdd);
		if (r < 0)
			return (r);
		path_table_size += r;
	}

	/* Write padding data. */
	path_table_size = path_table_size % PATH_TABLE_BLOCK_SIZE;
	if (path_table_size > 0)
		r = write_null(a, PATH_TABLE_BLOCK_SIZE - path_table_size);
	return (r);
}